

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::Revive(AActor *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ActorFlags6 AVar5;
  int iVar6;
  AActor *pAVar7;
  
  pAVar7 = GetDefault(this);
  uVar1 = (pAVar7->flags).Value;
  uVar2 = (pAVar7->flags2).Value;
  uVar3 = (pAVar7->flags3).Value;
  uVar4 = (pAVar7->flags4).Value;
  (this->flags).Value = uVar1;
  (this->flags2).Value = uVar2;
  (this->flags3).Value = uVar3;
  (this->flags4).Value = uVar4;
  AVar5.Value = (pAVar7->flags6).Value;
  this->flags5 = (ActorFlags5)(pAVar7->flags5).Value;
  this->flags6 = (ActorFlags6)AVar5.Value;
  (this->flags7).Value = (pAVar7->flags7).Value;
  if ((this->SpawnFlags & 0x2000) != 0) {
    (this->flags).Value = uVar1 | 0x8000000;
  }
  (this->DamageType).super_FName.Index = (pAVar7->DamageType).super_FName.Index;
  iVar6 = SpawnHealth(this);
  this->health = iVar6;
  this->target = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  this->lastenemy = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  if (((this->flags).Value & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  return;
}

Assistant:

void AActor::Revive()
{
	AActor *info = GetDefault();
	flags = info->flags;
	flags2 = info->flags2;
	flags3 = info->flags3;
	flags4 = info->flags4;
	flags5 = info->flags5;
	flags6 = info->flags6;
	flags7 = info->flags7;
	if (SpawnFlags & MTF_FRIENDLY) flags |= MF_FRIENDLY;
	DamageType = info->DamageType;
	health = SpawnHealth();
	target = NULL;
	lastenemy = NULL;

	// [RH] If it's a monster, it gets to count as another kill
	if (CountsAsKill())
	{
		level.total_monsters++;
	}
}